

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O0

void __thiscall QHttp2Stream::uploadDeviceDestroyed(QHttp2Stream *this)

{
  long lVar1;
  bool bVar2;
  QHttp2Stream *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  undefined1 in_stack_00000050 [16];
  QString *in_stack_ffffffffffffffa8;
  char *s;
  undefined1 in_stack_ffffffffffffffb8 [16];
  Http2Error in_stack_ffffffffffffffd4;
  QHttp2Stream *in_stack_ffffffffffffffd8;
  QLatin1StringView in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isUploadingDATA((QHttp2Stream *)in_RDI);
  s = in_stack_ffffffffffffffb8._0_8_;
  if (bVar2) {
    QLatin1String::QLatin1String(in_stack_ffffffffffffffb8._8_8_,s);
    streamError(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                (QLatin1StringView)in_stack_00000050);
    QVar3 = Qt::Literals::StringLiterals::operator____L1(s,(size_t)in_RDI);
    QString::QString((QString *)QVar3.m_data,in_stack_ffffffffffffffe0);
    uploadDeviceError(in_RDI,in_stack_ffffffffffffffa8);
    QString::~QString((QString *)0x2b3262);
  }
  in_RDI->m_uploadDevice = (QIODevice *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Stream::uploadDeviceDestroyed()
{
    if (isUploadingDATA()) {
        // We're in the middle of sending DATA frames, we need to abort
        // the stream.
        streamError(CANCEL, QLatin1String("Upload device destroyed while uploading"));
        emit uploadDeviceError("Upload device destroyed while uploading"_L1);
    }
    m_uploadDevice = nullptr;
}